

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

matroska_block *
MATROSKA_GetBlockForTimestamp(matroska_cluster *Cluster,mkv_timestamp_t Timestamp,int16_t Track)

{
  uint16_t uVar1;
  ebml_context *peVar2;
  bool_t bVar3;
  mkv_timestamp_t mVar4;
  matroska_block *local_38;
  ebml_element *GBlock;
  ebml_element *Block;
  int16_t Track_local;
  mkv_timestamp_t Timestamp_local;
  matroska_cluster *Cluster_local;
  
  GBlock = (ebml_element *)(Cluster->Base).Base.Base.Children;
  do {
    if (GBlock == (ebml_element *)0x0) {
      return (matroska_block *)0x0;
    }
    peVar2 = MATROSKA_getContextBlockGroup();
    bVar3 = EBML_ElementIsType(GBlock,peVar2);
    if (bVar3 == 0) {
      peVar2 = MATROSKA_getContextSimpleBlock();
      bVar3 = EBML_ElementIsType(GBlock,peVar2);
      if (((bVar3 != 0) &&
          (uVar1 = MATROSKA_BlockTrackNum((matroska_block *)GBlock), (uint)uVar1 == (int)Track)) &&
         (mVar4 = MATROSKA_BlockTimestamp((matroska_block *)GBlock), mVar4 == Timestamp)) {
        return (matroska_block *)GBlock;
      }
    }
    else {
      for (local_38 = (matroska_block *)(GBlock->Base).Children; local_38 != (matroska_block *)0x0;
          local_38 = (matroska_block *)(local_38->Base).Base.Base.Next) {
        peVar2 = MATROSKA_getContextBlock();
        bVar3 = EBML_ElementIsType((ebml_element *)local_38,peVar2);
        if (((bVar3 != 0) && (uVar1 = MATROSKA_BlockTrackNum(local_38), (uint)uVar1 == (int)Track))
           && (mVar4 = MATROSKA_BlockTimestamp(local_38), mVar4 == Timestamp)) {
          return local_38;
        }
        if (local_38 == (matroska_block *)(local_38->Base).Base.Base.Next) {
          __assert_fail("(nodetree*)(GBlock) != ((nodetree*)(GBlock))->Next",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x360,
                        "matroska_block *MATROSKA_GetBlockForTimestamp(matroska_cluster *, mkv_timestamp_t, int16_t)"
                       );
        }
      }
    }
    if (GBlock == (ebml_element *)(GBlock->Base).Next) {
      __assert_fail("(nodetree*)(Block) != ((nodetree*)(Block))->Next",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x35c,
                    "matroska_block *MATROSKA_GetBlockForTimestamp(matroska_cluster *, mkv_timestamp_t, int16_t)"
                   );
    }
    GBlock = (ebml_element *)(GBlock->Base).Next;
  } while( true );
}

Assistant:

matroska_block *MATROSKA_GetBlockForTimestamp(matroska_cluster *Cluster, mkv_timestamp_t Timestamp, int16_t Track)
{
    ebml_element *Block, *GBlock;
    for (Block = EBML_MasterChildren(Cluster);Block;Block=EBML_MasterNext(Block))
    {
        if (EBML_ElementIsType(Block, MATROSKA_getContextBlockGroup()))
        {
            for (GBlock = EBML_MasterChildren(Block);GBlock;GBlock=EBML_MasterNext(GBlock))
            {
                if (EBML_ElementIsType(GBlock, MATROSKA_getContextBlock()))
                {
                    if (MATROSKA_BlockTrackNum((matroska_block*)GBlock) == Track &&
                        MATROSKA_BlockTimestamp((matroska_block*)GBlock) == Timestamp)
                    {
                        return (matroska_block*)GBlock;
                    }
                }
            }
        }
        else if (EBML_ElementIsType(Block, MATROSKA_getContextSimpleBlock()))
        {
            if (MATROSKA_BlockTrackNum((matroska_block*)Block) == Track &&
                MATROSKA_BlockTimestamp((matroska_block*)Block) == Timestamp)
            {
                return (matroska_block*)Block;
            }
        }
    }
    return NULL;
}